

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

int __thiscall QMainWindowLayoutState::remove(QMainWindowLayoutState *this,char *__filename)

{
  long lVar1;
  bool bVar2;
  QDockWidget *pQVar3;
  long in_FS_OFFSET;
  QDockWidget *dockWidget;
  QList<int> path;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QToolBarAreaLayout::remove(&this->toolBarAreaLayout,__filename);
  (**(code **)(*(long *)__filename + 0x68))();
  pQVar3 = qobject_cast<QDockWidget*>((QObject *)0x5f42bb);
  if (pQVar3 != (QDockWidget *)0x0) {
    QDockAreaLayout::indexOf
              ((QDockAreaLayout *)&DAT_aaaaaaaaaaaaaaaa,(QWidget *)&DAT_aaaaaaaaaaaaaaaa);
    bVar2 = QList<int>::isEmpty((QList<int> *)0x5f4311);
    if (!bVar2) {
      QDockAreaLayout::remove(&this->dockAreaLayout,&stack0xffffffffffffffe0);
    }
    QList<int>::~QList((QList<int> *)0x5f4335);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayoutState::remove(QLayoutItem *item)
{
#if QT_CONFIG(toolbar)
    toolBarAreaLayout.remove(item);
#endif

#if QT_CONFIG(dockwidget)
    // is it a dock widget?
    if (QDockWidget *dockWidget = qobject_cast<QDockWidget *>(item->widget())) {
        QList<int> path = dockAreaLayout.indexOf(dockWidget);
        if (!path.isEmpty())
            dockAreaLayout.remove(path);
    }
#endif // QT_CONFIG(dockwidget)
}